

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::writeSequentialContainer<QList<QKeyCombination>>
          (QDataStream *s,QList<QKeyCombination> *c)

{
  QKeyCombination *pQVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  bVar3 = QDataStream::writeQSizeType(s,(c->d).size);
  if (bVar3) {
    pQVar1 = (c->d).ptr;
    lVar2 = (c->d).size;
    for (lVar4 = 0; lVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
      QDataStream::operator<<(s,*(int *)((long)&pQVar1->combination + lVar4));
    }
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}